

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase885::run(TestCase885 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  DebugExpression<bool> _kjCondition_3;
  DebugExpression<bool> _kjCondition_1;
  undefined7 uStack_347;
  int iStack_344;
  TestChild child2;
  TestChild child1;
  WaitScope waitScope;
  TestChild child3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>
  _kjDefer895;
  UnixEventPort port;
  EventLoop loop;
  sigset_t sigs;
  sigset_t oldsigs;
  
  if ((anonymous_namespace)::BROKEN_QEMU == '\0') {
    captureSignals();
    do {
      iVar2 = sigemptyset((sigset_t *)&sigs);
      if (-1 < iVar2) goto LAB_001cec14;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&port,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37c,iVar2,"sigemptyset(&sigs)","");
      kj::_::Debug::Fault::fatal((Fault *)&port);
    }
LAB_001cec14:
    do {
      iVar2 = sigaddset((sigset_t *)&sigs,0xf);
      if (-1 < iVar2) goto LAB_001cec3c;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&port,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37d,iVar2,"sigaddset(&sigs, SIGTERM)","");
      kj::_::Debug::Fault::fatal((Fault *)&port);
    }
LAB_001cec3c:
    do {
      iVar2 = pthread_sigmask(0,(__sigset_t *)&sigs,(__sigset_t *)&oldsigs);
      if (-1 < iVar2) goto LAB_001cec6e;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&port,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x37e,iVar2,"pthread_sigmask(SIG_BLOCK, &sigs, &oldsigs)","");
      kj::_::Debug::Fault::fatal((Fault *)&port);
    }
LAB_001cec6e:
    _kjDefer895.maybeFunc.ptr.isSet = true;
    _kjDefer895.maybeFunc.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_unix_test_c__:895:3)>_2
          )&oldsigs;
    UnixEventPort::UnixEventPort(&port);
    EventLoop::EventLoop(&loop,&port.super_EventPort);
    waitScope.busyPollInterval = 0xffffffff;
    waitScope.fiber.ptr = (FiberBase *)0x0;
    waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
    waitScope.loop = &loop;
    EventLoop::enterScope(&loop);
    TestChild::TestChild(&child1,&port,0x7b);
    __kjCondition_1 =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location.function = "run";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location.lineNumber = 0x386;
    location.columnNumber = 0x2c;
    bVar1 = kj::_::pollImpl((PromiseNode *)child1.promise.super_PromiseBase.node.ptr,&waitScope,
                            location);
    child2.pid.ptr.isSet = !bVar1;
    iVar2 = extraout_EDX;
    if (bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x386,ERROR,
                 "\"failed: expected \" \"!child1.promise.poll(waitScope)\", _kjCondition",
                 (char (*) [49])"failed: expected !child1.promise.poll(waitScope)",
                 (DebugExpression<bool> *)&child2);
      iVar2 = extraout_EDX_00;
    }
    TestChild::kill(&child1,0xf,iVar2);
    uVar3 = Promise<int>::wait(&child1.promise,&waitScope);
    bVar1 = (uVar3 & 0x7f) == 0;
    _kjCondition_1.value = bVar1;
    if (kj::_::Debug::minSeverity < 3 && !bVar1) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x38c,ERROR,"\"failed: expected \" \"WIFEXITED(status)\", _kjCondition",
                 (char (*) [35])"failed: expected WIFEXITED(status)",&_kjCondition_1);
    }
    __kjCondition_1 = uVar3 >> 8 & 0xff;
    iStack_344 = 0x7b;
    if ((__kjCondition_1 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x38d,ERROR,"\"failed: expected \" \"WEXITSTATUS(status) == 123\", _kjCondition",
                 (char (*) [44])"failed: expected WEXITSTATUS(status) == 123",
                 (DebugComparison<int,_int> *)&_kjCondition_1);
    }
    TestChild::TestChild(&child2,&port,0xea);
    TestChild::TestChild(&child3,&port,0x159);
    __kjCondition_1 =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_00.function = "run";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_00.lineNumber = 0x393;
    location_00.columnNumber = 0x2c;
    bVar1 = kj::_::pollImpl((PromiseNode *)child2.promise.super_PromiseBase.node.ptr,&waitScope,
                            location_00);
    _kjCondition_3.value = !bVar1;
    if (bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x393,ERROR,
                 "\"failed: expected \" \"!child2.promise.poll(waitScope)\", _kjCondition",
                 (char (*) [49])"failed: expected !child2.promise.poll(waitScope)",&_kjCondition_3);
    }
    __kjCondition_1 =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_01.function = "run";
    location_01.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_01.lineNumber = 0x394;
    location_01.columnNumber = 0x2c;
    bVar1 = kj::_::pollImpl((PromiseNode *)child3.promise.super_PromiseBase.node.ptr,&waitScope,
                            location_01);
    _kjCondition_3.value = !bVar1;
    iVar2 = extraout_EDX_01;
    if (bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x394,ERROR,
                 "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
                 (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&_kjCondition_3);
      iVar2 = extraout_EDX_02;
    }
    TestChild::kill(&child2,9,iVar2);
    uVar3 = Promise<int>::wait(&child2.promise,&waitScope);
    uVar3 = uVar3 & 0x7f;
    if (kj::_::Debug::minSeverity < 3 && uVar3 == 0) {
      _kjCondition_1.value = uVar3 != 0;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x39a,ERROR,"\"failed: expected \" \"!WIFEXITED(status)\", _kjCondition",
                 (char (*) [36])"failed: expected !WIFEXITED(status)",&_kjCondition_1);
    }
    iVar2 = uVar3 * 0x1000000 + 0x1000000;
    _kjCondition_1.value = 0x1ffffff < iVar2;
    if (kj::_::Debug::minSeverity < 3 &&
        SBORROW4(iVar2,0x2000000) != (int)(uVar3 * 0x1000000 + -0x1000000) < 0) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x39b,ERROR,"\"failed: expected \" \"WIFSIGNALED(status)\", _kjCondition",
                 (char (*) [37])"failed: expected WIFSIGNALED(status)",&_kjCondition_1);
    }
    iStack_344 = 9;
    __kjCondition_1 = uVar3;
    if ((uVar3 != 9) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x39c,ERROR,"\"failed: expected \" \"WTERMSIG(status) == SIGKILL\", _kjCondition",
                 (char (*) [45])"failed: expected WTERMSIG(status) == SIGKILL",
                 (DebugComparison<int,_int> *)&_kjCondition_1);
    }
    __kjCondition_1 =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_02.function = "run";
    location_02.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
    ;
    location_02.lineNumber = 0x39f;
    location_02.columnNumber = 0x2c;
    bVar1 = kj::_::pollImpl((PromiseNode *)child3.promise.super_PromiseBase.node.ptr,&waitScope,
                            location_02);
    _kjCondition_3.value = !bVar1;
    if (bVar1 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                 ,0x39f,ERROR,
                 "\"failed: expected \" \"!child3.promise.poll(waitScope)\", _kjCondition",
                 (char (*) [49])"failed: expected !child3.promise.poll(waitScope)",&_kjCondition_3);
    }
    TestChild::~TestChild(&child3);
    TestChild::~TestChild(&child2);
    TestChild::~TestChild(&child1);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:895:3)>
    ::~Deferred(&_kjDefer895);
  }
  return;
}

Assistant:

TEST(Async, ArrayJoinFailFastException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  uint tasksCompleted = 0;
  auto pafs = makeCompletionCountingPafs(5, tasksCompleted);
  auto& fulfillers = pafs.fulfillers;
  Promise<void> promise = joinPromisesFailFast(kj::mv(pafs.promises));

  {
    uint i = 0;
    KJ_EXPECT(tasksCompleted == 0);

    // Joined tasks are completed eagerly, not waiting until the join node is awaited.
    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->fulfill();
    KJ_EXPECT(!promise.poll(waitScope));
    KJ_EXPECT(tasksCompleted == i);

    fulfillers[i++]->reject(KJ_EXCEPTION(FAILED, "Test exception"));

    // The first rejection makes the promise ready.
    KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("Test exception", promise.wait(waitScope));
    KJ_EXPECT(tasksCompleted == i - 1);
  }
}